

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Character.cpp
# Opt level: O0

void __thiscall Character::Defend(Character *this,int attackRoll)

{
  int iVar1;
  int damage;
  int defendRoll;
  int attackRoll_local;
  Character *this_local;
  
  iVar1 = (*this->_vptr_Character[1])();
  iVar1 = (attackRoll - iVar1) - this->armor;
  if ((0 < iVar1) &&
     (this->currentStrengthPoints = this->currentStrengthPoints - iVar1,
     this->currentStrengthPoints < 1)) {
    this->alive = false;
  }
  return;
}

Assistant:

void Character::Defend(int attackRoll)
{
    int defendRoll = this->RollDefense();
    int damage = attackRoll - defendRoll - armor;

    //std::cout << "Defender rolls: " << defendRoll << std::endl;

    if(damage > 0)
    {
        currentStrengthPoints -= damage;

        if(currentStrengthPoints <= 0)
        {
            alive = false;
        }
    }

}